

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O1

void __thiscall
BuildsMetaMakefileGenerator::accumulateVariableFromBuilds
          (BuildsMetaMakefileGenerator *this,ProKey *name,Build *dst)

{
  long lVar1;
  Build **ppBVar2;
  Build *pBVar3;
  ProString *b;
  QMakeProject *pQVar4;
  ProStringList *this_00;
  ProStringList *pPVar5;
  long lVar6;
  
  pQVar4 = MakefileGenerator::projectFile(dst->makefile);
  this_00 = QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,name);
  lVar1 = (this->makefiles).d.size;
  if (lVar1 != 0) {
    ppBVar2 = (this->makefiles).d.ptr;
    lVar6 = 0;
    do {
      pBVar3 = *(Build **)((long)ppBVar2 + lVar6);
      if (pBVar3 != dst) {
        pQVar4 = MakefileGenerator::projectFile(pBVar3->makefile);
        pPVar5 = QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,name);
        b = (pPVar5->super_QList<ProString>).d.ptr;
        QtPrivate::QCommonArrayOps<ProString>::growAppend
                  ((QCommonArrayOps<ProString> *)this_00,b,
                   b + (pPVar5->super_QList<ProString>).d.size);
      }
      lVar6 = lVar6 + 8;
    } while (lVar1 << 3 != lVar6);
  }
  ProStringList::removeDuplicates(this_00);
  return;
}

Assistant:

void BuildsMetaMakefileGenerator::accumulateVariableFromBuilds(const ProKey &name, Build *dst) const
{
    ProStringList &values = dst->makefile->projectFile()->values(name);
    for (auto build : makefiles) {
        if (build != dst)
            values += build->makefile->projectFile()->values(name);
    }
    values.removeDuplicates();
}